

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

void drop_near(chunk *c,object **dropped,wchar_t chance,loc_conflict grid,_Bool verbose,
              _Bool prefer_pile)

{
  _Bool _Var1;
  wchar_t wVar2;
  square_conflict *psVar3;
  byte local_82;
  _Bool local_81;
  loc_conflict lStack_80;
  _Bool dont_ignore;
  loc_conflict best;
  char o_name [80];
  _Bool prefer_pile_local;
  _Bool verbose_local;
  wchar_t chance_local;
  object **dropped_local;
  chunk *c_local;
  loc_conflict grid_local;
  
  local_82 = 0;
  lStack_80 = grid;
  if (verbose) {
    _Var1 = ignore_item_ok(player,*dropped);
    local_82 = _Var1 ^ 0xff;
  }
  local_81 = (_Bool)(local_82 & 1);
  if (c == (chunk *)cave) {
    object_desc((char *)&best,0x50,*dropped,0,player);
    if (((*dropped)->artifact == (artifact *)0x0) && (wVar2 = Rand_div(100), wVar2 < chance)) {
      floor_carry_fail(c,*dropped,true);
    }
    else {
      drop_find_grid(player,c,*dropped,prefer_pile,&stack0xffffffffffffff80);
      _Var1 = floor_carry(c,lStack_80,*dropped,&local_81);
      if (_Var1) {
        sound(5);
        if (((local_81 & 1U) != 0) && (psVar3 = square(c,lStack_80), psVar3->mon < 0)) {
          msg("You feel something roll beneath your feet.");
        }
      }
      else {
        floor_carry_fail(c,*dropped,false);
      }
    }
    return;
  }
  __assert_fail("c == cave",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-pile.c"
                ,0x470,
                "void drop_near(struct chunk *, struct object **, int, struct loc, _Bool, _Bool)");
}

Assistant:

void drop_near(struct chunk *c, struct object **dropped, int chance,
			   struct loc grid, bool verbose, bool prefer_pile)
{
	char o_name[80];
	struct loc best = grid;
	bool dont_ignore = verbose && !ignore_item_ok(player, *dropped);

	/* Only called in the current level */
	assert(c == cave);

	/* Describe object */
	object_desc(o_name, sizeof(o_name), *dropped, ODESC_BASE, player);

	/* Handle normal breakage */
	if (!((*dropped)->artifact) && (randint0(100) < chance)) {
		floor_carry_fail(c, *dropped, true);
		return;
	}

	/* Find the best grid and drop the item, destroying if there's no space */
	drop_find_grid(player, c, *dropped, prefer_pile, &best);
	if (floor_carry(c, best, *dropped, &dont_ignore)) {
		sound(MSG_DROP);
		if (dont_ignore && (square(c, best)->mon < 0)) {
			msg("You feel something roll beneath your feet.");
		}
	} else {
		floor_carry_fail(c, *dropped, false);
	}
}